

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int tableAndColumnIndex(SrcList *pSrc,int N,char *zCol,int *piTab,int *piCol)

{
  int iVar1;
  int local_3c;
  int iCol;
  int i;
  int *piCol_local;
  int *piTab_local;
  char *zCol_local;
  int N_local;
  SrcList *pSrc_local;
  
  local_3c = 0;
  while( true ) {
    if (N <= local_3c) {
      return 0;
    }
    iVar1 = columnIndex(pSrc->a[local_3c].pTab,zCol);
    if (-1 < iVar1) break;
    local_3c = local_3c + 1;
  }
  if (piTab != (int *)0x0) {
    *piTab = local_3c;
    *piCol = iVar1;
  }
  return 1;
}

Assistant:

static int tableAndColumnIndex(
  SrcList *pSrc,       /* Array of tables to search */
  int N,               /* Number of tables in pSrc->a[] to search */
  const char *zCol,    /* Name of the column we are looking for */
  int *piTab,          /* Write index of pSrc->a[] here */
  int *piCol           /* Write index of pSrc->a[*piTab].pTab->aCol[] here */
){
  int i;               /* For looping over tables in pSrc */
  int iCol;            /* Index of column matching zCol */

  assert( (piTab==0)==(piCol==0) );  /* Both or neither are NULL */
  for(i=0; i<N; i++){
    iCol = columnIndex(pSrc->a[i].pTab, zCol);
    if( iCol>=0 ){
      if( piTab ){
        *piTab = i;
        *piCol = iCol;
      }
      return 1;
    }
  }
  return 0;
}